

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O3

void __thiscall reader_authority_suite::test_host_regname::test_method(test_host_regname *this)

{
  undefined1 *puVar1;
  view_type *local_168;
  char local_160 [4];
  view_type local_15c;
  undefined8 local_148;
  shared_count sStack_140;
  undefined **local_138;
  undefined1 local_130;
  undefined8 *local_128;
  char *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  undefined1 *local_100;
  undefined **local_f8;
  undefined1 local_f0;
  undefined8 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  base<char,_trial::url::reader::basic_authority> local_c8;
  char input [12];
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  builtin_strncpy(input,"example.com",0xc);
  local_c8.input.len_ = strlen(input);
  local_c8.current_token = end;
  local_c8.input.ptr_ = input;
  local_c8.current_view.ptr_ = input;
  local_c8.current_view.len_ = local_c8.input.len_;
  trial::url::reader::basic_authority<char>::do_next((basic_authority<char> *)&local_c8);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x46);
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_00186288;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_15c.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_authority>::code(&local_c8);
  local_168 = &local_15c;
  local_15c._4_8_ = local_160;
  local_160[0] = '\x04';
  local_160[1] = '\0';
  local_160[2] = '\0';
  local_160[3] = '\0';
  local_15c.len_._4_1_ = (value)local_15c.ptr_ == authority_host;
  local_148 = 0;
  sStack_140.pi_ = (sp_counted_base *)0x0;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_d0 = "";
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_00186558;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)((long)&local_15c.ptr_ + 4);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_00186558;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_100 = (undefined1 *)&local_168;
  boost::test_tools::tt_detail::report_assertion
            ((undefined1 *)((long)&local_15c.len_ + 4),&local_138,&local_d8,0x46,2,2,2,
             "reader.code()",&local_118,"url::token::code::authority_host",&local_f8);
  boost::detail::shared_count::~shared_count(&sStack_140);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x47);
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_00186288;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_15c.ptr_._0_4_ = local_c8.current_token;
  local_15c.len_._4_1_ = local_c8.current_token == authority_host_name;
  local_160[0] = '\x04';
  local_160[1] = '\0';
  local_160[2] = '\0';
  local_160[3] = '\0';
  local_148 = 0;
  sStack_140.pi_ = (sp_counted_base *)0x0;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_d0 = "";
  local_168 = &local_15c;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_00186618;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_15c._4_8_ = local_160;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_00186618;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  puVar1 = (undefined1 *)((long)&local_15c.ptr_ + 4);
  local_100 = (undefined1 *)&local_168;
  local_e0 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            ((undefined1 *)((long)&local_15c.len_ + 4),&local_138,&local_d8,0x47,2,2,2,
             "reader.subcode()",&local_118,"url::token::subcode::authority_host_name",&local_f8);
  boost::detail::shared_count::~shared_count(&sStack_140);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_78 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x48);
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_00186288;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  if (local_c8.current_view.len_ == 0xb) {
    local_15c.len_._4_1_ =
         *(long *)((long)local_c8.current_view.ptr_ + 3) == 0x6d6f632e656c706d &&
         *(long *)local_c8.current_view.ptr_ == 0x2e656c706d617865;
  }
  else {
    local_15c.len_._4_1_ = false;
  }
  local_148 = 0;
  sStack_140.pi_ = (sp_counted_base *)0x0;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_d0 = "";
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_00186598;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_15c._4_8_ = "example.com";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_00186458;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_168 = &local_c8.current_view;
  local_100 = (undefined1 *)&local_168;
  local_e0 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            ((undefined1 *)((long)&local_15c.len_ + 4),&local_138,&local_d8,0x48,2,2,2,
             "reader.literal()",&local_118,"\"example.com\"",&local_f8);
  boost::detail::shared_count::~shared_count(&sStack_140);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_host_regname)
{
    const char input[] = "example.com";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_host);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
}